

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

type * Disa::operator-(type *__return_storage_ptr__,Vector_Dense<double,_3UL> *vector0,
                      Vector_Dense<double,_3UL> *vector1)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_10 = std::
             _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_dense.hpp:341:25)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_dense.hpp:341:25)>
             ::_M_manager;
  local_28._M_unused._M_object = vector0;
  local_28._8_8_ = vector1;
  Vector_Dense<double,_3UL>::Vector_Dense
            (__return_storage_ptr__,(function<double_(unsigned_long)> *)&local_28,3);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type operator-(
const Vector_Dense<_type, _size_0>& vector0, const Vector_Dense<_type, _size_1>& vector1) {
  ASSERT_DEBUG(vector0.size() == vector1.size(), "Incompatible vector sizes, " + std::to_string(vector0.size()) +
                                                 " vs. " + std::to_string(vector1.size()) + ".");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  return _return_vector([&](const std::size_t ii) { return vector0[ii] - vector1[ii]; }, vector0.size());
}